

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_ctzi_i32_mips64el
               (TCGContext_conflict6 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,uint32_t arg2)

{
  uintptr_t o_2;
  TCGv_i32 pTVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  uintptr_t o;
  
  pTVar1 = tcg_const_i32_mips64el(tcg_ctx,arg2);
  pTVar2 = tcg_emit_op_mips64el(tcg_ctx,INDEX_op_ctz_i32);
  pTVar2->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar2->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(pTVar1 + (long)tcg_ctx);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_ctzi_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, uint32_t arg2)
{
    if (!TCG_TARGET_HAS_ctz_i32 && TCG_TARGET_HAS_ctpop_i32 && arg2 == 32) {
        /* This equivalence has the advantage of not requiring a fixup.  */
        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_subi_i32(tcg_ctx, t, arg1, 1);
        tcg_gen_andc_i32(tcg_ctx, t, t, arg1);
        tcg_gen_ctpop_i32(tcg_ctx, ret, t);
        tcg_temp_free_i32(tcg_ctx, t);
    } else {
        TCGv_i32 t = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_ctz_i32(tcg_ctx, ret, arg1, t);
        tcg_temp_free_i32(tcg_ctx, t);
    }
}